

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sandbox.cpp
# Opt level: O2

void __thiscall Sandbox::error(Sandbox *this,AccessType type,u32 addr,u64 cycle,u32 fc,u16 value)

{
  long lVar1;
  ulong uVar2;
  u32 *puVar3;
  
  lVar1 = this->errors;
  this->errors = lVar1 + 1;
  if (lVar1 == 0) {
    printf("\nACCESS %d DOESN\'T MATCH:\n",(ulong)(uint)this->replayCnt);
    printf("i: %2d  ",(ulong)(uint)this->replayCnt);
    printf("Type: %s  ",accessTypeStr[type]);
    printf("Addr: %4x  ",(ulong)addr);
    printf("Cycle: %3lu  ",cycle);
    printf("FC: %d  ",(ulong)fc);
    if ((type & ~PEEK16) == POKE8) {
      printf("Value: %4x  ",(ulong)value);
    }
    puts("\n");
    puts("ACCESS RECORD:");
    puVar3 = &this->access[0].fc;
    for (uVar2 = 0; (long)uVar2 < (long)this->recordCnt; uVar2 = uVar2 + 1) {
      printf("i: %2d  ",uVar2 & 0xffffffff);
      printf("Type: %s  ",accessTypeStr[((AccessRecord *)(puVar3 + -6))->type]);
      printf("Addr: %4x  ",(ulong)puVar3[-5]);
      printf("Cycle: %3lu  ",*(u64 *)(puVar3 + -2));
      printf("FC: %d  ",(ulong)*puVar3);
      printf("Value: %4x  ",(ulong)*(ushort *)(puVar3 + -4));
      putchar(10);
      puVar3 = puVar3 + 8;
    }
  }
  return;
}

Assistant:

void
Sandbox::error(AccessType type, u32 addr, u64 cycle, u32 fc, u16 value)
{
    if (errors++ == 0) {

        printf("\nACCESS %d DOESN'T MATCH:\n", replayCnt);
        printf("i: %2d  ", replayCnt);
        printf("Type: %s  ", accessTypeStr[type]);
        printf("Addr: %4x  ", addr);
        printf("Cycle: %3lu  ", (long)cycle);
        printf("FC: %d  ", fc);
        if (type == POKE8 || type == POKE16) printf("Value: %4x  ", value);
        printf("\n\n");

        printf("ACCESS RECORD:\n");
        for (int i = 0; i < recordCnt; i++) {
            printf("i: %2d  ", i);
            printf("Type: %s  ", accessTypeStr[access[i].type]);
            printf("Addr: %4x  ", access[i].addr);
            printf("Cycle: %3lu  ", (long)access[i].cycle);
            printf("FC: %d  ", access[i].fc);
            printf("Value: %4x  ", access[i].value);
            printf("\n");
        }
    }
}